

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall
lzham::lzcompressor::coding_stats::update
          (coding_stats *this,lzdecision *lzdec,state *cur_state,search_accelerator *dict,
          bit_cost_t cost)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  bit_cost_t bVar7;
  uchar *puVar8;
  uchar *puVar9;
  long in_RCX;
  long in_RDX;
  lzdecision *in_RSI;
  int *in_RDI;
  ulong in_R8;
  double dVar10;
  undefined4 uVar11;
  undefined4 uVar18;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int match_hist_index;
  bit_cost_t match_bit_cost_1;
  uint type_index;
  uint actual_match_len;
  uint match_dist;
  bit_cost_t match_bit_cost;
  uint is_match_model_index;
  uint match_pred;
  float cost_in_bits;
  uint match_len;
  uint8 *pLookahead;
  uint8 *pComp;
  uint lookahead_pos;
  uint comp_pos;
  int find_dict_size;
  uint in_stack_00000124;
  char *in_stack_00000128;
  char *in_stack_00000130;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  state *in_stack_ffffffffffffff30;
  state *in_stack_ffffffffffffff38;
  float local_a0;
  uint local_8c;
  uint local_3c;
  uint local_4;
  undefined1 auVar12 [16];
  
  uVar4 = lzdecision::get_len((lzdecision *)0x11c203);
  *in_RDI = *in_RDI + uVar4;
  in_RDI[1] = in_RDI[1] + 1;
  local_a0 = (float)in_R8;
  local_a0 = local_a0 / 16777216.0;
  *(double *)(in_RDI + 2) = (double)local_a0 + *(double *)(in_RDI + 2);
  uVar4 = state::get_pred_char
                    (in_stack_ffffffffffffff38,(search_accelerator *)in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  uVar5 = (uVar4 >> 2) + *(int *)(in_RDX + 4) * 0x40;
  if (in_RSI->m_len == 0) {
    bVar7 = adaptive_bit_model::get_cost((adaptive_bit_model *)(in_RDX + 0x1c + (ulong)uVar5 * 2),0)
    ;
    uVar18 = (undefined4)(bVar7 >> 0x20);
    auVar12._8_4_ = uVar18;
    auVar12._0_8_ = bVar7;
    auVar12._12_4_ = 0x45300000;
    uVar11 = (undefined4)bVar7;
    *(double *)(in_RDI + 8) =
         *(double *)(in_RDI + 8) +
         (auVar12._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0);
    auVar13._8_4_ = uVar18;
    auVar13._0_8_ = bVar7;
    auVar13._12_4_ = 0x45300000;
    *(double *)(in_RDI + 4) =
         *(double *)(in_RDI + 4) +
         (auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0);
    auVar14._8_4_ = uVar18;
    auVar14._0_8_ = bVar7;
    auVar14._12_4_ = 0x45300000;
    dVar10 = math::maximum<double>
                       (*(double *)(in_RDI + 6),
                        (auVar14._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0));
    *(double *)(in_RDI + 6) = dVar10;
    in_RDI[0x28d] = in_RDI[0x28d] + 1;
    if (*(uint *)(in_RDX + 4) < 7) {
      in_RDI[0x28f] = in_RDI[0x28f] + 1;
      *(double *)(in_RDI + 0x290) = (double)local_a0 + *(double *)(in_RDI + 0x290);
      dVar10 = math::maximum<double>(*(double *)(in_RDI + 0x292),(double)local_a0);
      *(double *)(in_RDI + 0x292) = dVar10;
    }
    else {
      in_RDI[0x294] = in_RDI[0x294] + 1;
      *(double *)(in_RDI + 0x296) = (double)local_a0 + *(double *)(in_RDI + 0x296);
      dVar10 = math::maximum<double>(*(double *)(in_RDI + 0x298),(double)local_a0);
      *(double *)(in_RDI + 0x298) = dVar10;
    }
  }
  else {
    uVar4 = lzdecision::get_match_dist
                      ((lzdecision *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (*(int *)(in_RCX + 0x24) < (int)uVar4) {
      local_4 = 0;
    }
    else {
      uVar1 = *(uint *)(in_RCX + 0x1c);
      uVar2 = *(uint *)(in_RCX + 0x18);
      puVar8 = vector<unsigned_char>::operator[]
                         ((vector<unsigned_char> *)(in_RCX + 0x28),
                          *(int *)(in_RCX + 0x1c) - uVar4 & *(uint *)(in_RCX + 0x18));
      puVar9 = vector<unsigned_char>::operator[]
                         ((vector<unsigned_char> *)(in_RCX + 0x28),uVar1 & uVar2);
      for (local_3c = 0; (local_3c < 0x101 && (puVar8[local_3c] == puVar9[local_3c]));
          local_3c = local_3c + 1) {
      }
      local_4 = local_3c;
    }
    uVar4 = lzdecision::get_len((lzdecision *)0x11c5be);
    if (local_4 < uVar4) {
      lzham_assert(in_stack_00000130,in_stack_00000128,in_stack_00000124);
    }
    uVar4 = lzdecision::get_len((lzdecision *)0x11c5e9);
    in_RDI[0xc] = (uint)(uVar4 < local_4) + in_RDI[0xc];
    uVar4 = lzdecision::get_len((lzdecision *)0x11c618);
    in_RDI[(ulong)(local_4 - uVar4) + 0xd] = in_RDI[(ulong)(local_4 - uVar4) + 0xd] + 1;
    local_8c = 4;
    bVar3 = lzdecision::is_full_match(in_RSI);
    if (!bVar3) {
      local_8c = 0xffffffff - in_RSI->m_dist;
    }
    uVar4 = lzdecision::get_len((lzdecision *)0x11c674);
    if (uVar4 < local_4) {
      uVar4 = lzdecision::get_len((lzdecision *)0x11c68b);
      in_RDI[(ulong)uVar4 + 0x10f] = in_RDI[(ulong)uVar4 + 0x10f] + 1;
      in_RDI[(ulong)*(uint *)(in_RDX + 4) * 5 + (ulong)local_8c + 0x211] =
           in_RDI[(ulong)*(uint *)(in_RDX + 4) * 5 + (ulong)local_8c + 0x211] + 1;
    }
    else {
      in_RDI[(ulong)*(uint *)(in_RDX + 4) * 5 + (ulong)local_8c + 0x24d] =
           in_RDI[(ulong)*(uint *)(in_RDX + 4) * 5 + (ulong)local_8c + 0x24d] + 1;
    }
    bVar7 = adaptive_bit_model::get_cost((adaptive_bit_model *)(in_RDX + 0x1c + (ulong)uVar5 * 2),1)
    ;
    uVar18 = (undefined4)(bVar7 >> 0x20);
    auVar15._8_4_ = uVar18;
    auVar15._0_8_ = bVar7;
    auVar15._12_4_ = 0x45300000;
    uVar11 = (undefined4)bVar7;
    *(double *)(in_RDI + 10) =
         *(double *)(in_RDI + 10) +
         (auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0);
    auVar16._8_4_ = uVar18;
    auVar16._0_8_ = bVar7;
    auVar16._12_4_ = 0x45300000;
    *(double *)(in_RDI + 4) =
         *(double *)(in_RDI + 4) +
         (auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0);
    auVar17._8_4_ = uVar18;
    auVar17._0_8_ = bVar7;
    auVar17._12_4_ = 0x45300000;
    dVar10 = math::maximum<double>
                       (*(double *)(in_RDI + 6),
                        (auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0));
    *(double *)(in_RDI + 6) = dVar10;
    in_RDI[0x28e] = in_RDI[0x28e] + 1;
    if (in_RSI->m_dist < 0) {
      in_RDI[0x29a] = in_RDI[0x29a] + 1;
      in_RDI[0x289] = in_RDI[0x289] + 1;
      iVar6 = -1 - in_RSI->m_dist;
      if (iVar6 == 0) {
        in_RDI[0x28a] = in_RDI[0x28a] + 1;
        if (in_RSI->m_len == 1) {
          in_RDI[0x29b] = in_RDI[0x29b] + 1;
          *(double *)(in_RDI + 0x29c) = (double)local_a0 + *(double *)(in_RDI + 0x29c);
          dVar10 = math::maximum<double>(*(double *)(in_RDI + 0x29e),(double)local_a0);
          *(double *)(in_RDI + 0x29e) = dVar10;
        }
        else {
          in_RDI[0x2a0] = in_RDI[0x2a0] + 1;
          *(double *)(in_RDI + 0x2a4) = (double)local_a0 + *(double *)(in_RDI + 0x2a4);
          dVar10 = math::maximum<double>(*(double *)(in_RDI + 0x2ac),(double)local_a0);
          *(double *)(in_RDI + 0x2ac) = dVar10;
        }
      }
      else {
        in_RDI[0x28b] = in_RDI[0x28b] + 1;
        if (1 < iVar6) {
          in_RDI[0x28c] = in_RDI[0x28c] + 1;
        }
        in_RDI[(long)iVar6 + 0x2a0] = in_RDI[(long)iVar6 + 0x2a0] + 1;
        *(double *)(in_RDI + (long)iVar6 * 2 + 0x2a4) =
             (double)local_a0 + *(double *)(in_RDI + (long)iVar6 * 2 + 0x2a4);
        dVar10 = math::maximum<double>
                           (*(double *)(in_RDI + (long)iVar6 * 2 + 0x2ac),(double)local_a0);
        *(double *)(in_RDI + (long)iVar6 * 2 + 0x2ac) = dVar10;
      }
    }
    else {
      uVar4 = lzdecision::get_len((lzdecision *)0x11c985);
      in_RDI[(ulong)uVar4 + 0x2b4] = in_RDI[(ulong)uVar4 + 0x2b4] + 1;
      dVar10 = (double)local_a0;
      uVar4 = lzdecision::get_len((lzdecision *)0x11c9bc);
      *(double *)(in_RDI + (ulong)uVar4 * 2 + 0x3b6) =
           dVar10 + *(double *)(in_RDI + (ulong)uVar4 * 2 + 0x3b6);
      uVar4 = lzdecision::get_len((lzdecision *)0x11c9ea);
      dVar10 = math::maximum<double>
                         (*(double *)(in_RDI + (ulong)uVar4 * 2 + 0x5ba),(double)local_a0);
      uVar4 = lzdecision::get_len((lzdecision *)0x11ca1e);
      *(double *)(in_RDI + (ulong)uVar4 * 2 + 0x5ba) = dVar10;
      uVar4 = lzdecision::get_len((lzdecision *)0x11ca43);
      if (uVar4 == 2) {
        if (in_RSI->m_dist < 0x201) {
          in_RDI[0x7bf] = in_RDI[0x7bf] + 1;
        }
        else {
          in_RDI[0x7be] = in_RDI[0x7be] + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void lzcompressor::coding_stats::update(const lzdecision& lzdec, const state& cur_state, const search_accelerator& dict, bit_cost_t cost)
   {
      m_total_bytes += lzdec.get_len();
      m_total_contexts++;

      float cost_in_bits = cost / (float)cBitCostScale;

      m_total_cost += cost_in_bits;

      uint match_pred = cur_state.get_pred_char(dict, lzdec.m_pos, 1);
      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(match_pred, cur_state.m_cur_state);

      if (lzdec.m_len == 0)
      {
         bit_cost_t match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(0);
         m_total_is_match0_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_nonmatches++;

         if (cur_state.m_cur_state < CLZBase::cNumLitStates)
         {
            m_total_lits++;
            m_total_lit_cost += cost_in_bits;
            m_worst_lit_cost = math::maximum<double>(m_worst_lit_cost, cost_in_bits);
         }
         else
         {
            m_total_delta_lits++;
            m_total_delta_lit_cost += cost_in_bits;
            m_worst_delta_lit_cost = math::maximum<double>(m_worst_delta_lit_cost, cost_in_bits);
         }
      }
      else
      {
         {
            uint match_dist = lzdec.get_match_dist(cur_state);

            uint actual_match_len = dict.get_match_len(0, match_dist, CLZBase::cMaxMatchLen);
            LZHAM_VERIFY(lzdec.get_len() <= actual_match_len);

            m_total_truncated_matches += lzdec.get_len() < actual_match_len;
            m_match_truncation_len_hist[actual_match_len - lzdec.get_len()]++;

            uint type_index = 4;
            if (!lzdec.is_full_match())
            {
               LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
               type_index = -lzdec.m_dist - 1;
            }

            if (actual_match_len > lzdec.get_len())
            {
               m_match_truncation_hist[lzdec.get_len()]++;

               m_match_type_truncation_hist[cur_state.m_cur_state][type_index]++;
            }
            else
            {
               m_match_type_was_not_truncated_hist[cur_state.m_cur_state][type_index]++;
            }
         }

         bit_cost_t match_bit_cost = cur_state.m_is_match_model[is_match_model_index].get_cost(1);
         m_total_is_match1_bits_cost += match_bit_cost;
         m_total_match_bits_cost += match_bit_cost;
         m_worst_match_bits_cost = math::maximum<double>(m_worst_match_bits_cost, static_cast<double>(match_bit_cost));
         m_total_matches++;

         if (lzdec.m_dist < 0)
         {
            m_total_reps++;
            m_total_is_rep0++;

            // rep match

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               m_total_is_rep0_len1++;

               // rep0 match
               if (lzdec.m_len == 1)
               {
                  m_total_rep0_len1_matches++;
                  m_total_rep0_len1_cost += cost_in_bits;
                  m_worst_rep0_len1_cost = math::maximum<double>(m_worst_rep0_len1_cost, cost_in_bits);
               }
               else
               {
                  m_total_rep_matches[0]++;
                  m_total_rep_cost[0] += cost_in_bits;
                  m_worst_rep_cost[0] = math::maximum<double>(m_worst_rep_cost[0], cost_in_bits);
               }
            }
            else
            {
               m_total_is_rep1++;

               if (match_hist_index > 1)
               {
                  m_total_is_rep2++;
               }

               LZHAM_ASSERT(match_hist_index < CLZBase::cMatchHistSize);
               m_total_rep_matches[match_hist_index]++;
               m_total_rep_cost[match_hist_index] += cost_in_bits;
               m_worst_rep_cost[match_hist_index] = math::maximum<double>(m_worst_rep_cost[match_hist_index], cost_in_bits);
            }
         }
         else
         {
            m_total_full_matches[lzdec.get_len()]++;
            m_total_full_match_cost[lzdec.get_len()] += cost_in_bits;
            m_worst_full_match_cost[lzdec.get_len()] = math::maximum<double>(m_worst_full_match_cost[lzdec.get_len()], cost_in_bits);

            if (lzdec.get_len() == 2)
            {
               if (lzdec.m_dist <= 512)
                  m_total_near_len2_matches++;
               else
                  m_total_far_len2_matches++;
            }
         }
      }
   }